

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

size_t __thiscall CServiceHash::operator()(CServiceHash *this,CService *a)

{
  uint uVar1;
  CService *pCVar2;
  uint64_t uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  CSipHasher hasher;
  CSipHasher local_40;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher(&local_40,this->m_salt_k0,this->m_salt_k1);
  CSipHasher::Write(&local_40,(ulong)(a->super_CNetAddr).m_net);
  CSipHasher::Write(&local_40,(ulong)a->port);
  uVar1 = (a->super_CNetAddr).m_addr._size;
  uVar4 = uVar1 - 0x11;
  pCVar2 = (CService *)(a->super_CNetAddr).m_addr._union.indirect_contents.indirect;
  if (uVar1 < 0x11) {
    uVar4 = uVar1;
    pCVar2 = a;
  }
  data.m_size._0_4_ = uVar4;
  data.m_data = (uchar *)pCVar2;
  data.m_size._4_4_ = 0;
  CSipHasher::Write(&local_40,data);
  uVar3 = CSipHasher::Finalize(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t operator()(const CService& a) const noexcept
    {
        CSipHasher hasher(m_salt_k0, m_salt_k1);
        hasher.Write(a.m_net);
        hasher.Write(a.port);
        hasher.Write(a.m_addr);
        return static_cast<size_t>(hasher.Finalize());
    }